

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_NodeUnionLists(Vec_Ptr_t *vArr1,Vec_Ptr_t *vArr2,Vec_Ptr_t *vArr)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  void **ppvVar5;
  void **ppvVar6;
  void **ppvVar7;
  void **ppvVar8;
  void **ppvVar9;
  int iVar10;
  
  ppvVar9 = vArr1->pArray;
  ppvVar8 = vArr2->pArray;
  iVar4 = vArr1->nSize;
  iVar1 = vArr2->nSize;
  iVar10 = iVar1 + iVar4;
  if (vArr->nCap < iVar10) {
    if (vArr->pArray == (void **)0x0) {
      ppvVar5 = (void **)malloc((long)iVar10 << 3);
    }
    else {
      ppvVar5 = (void **)realloc(vArr->pArray,(long)iVar10 << 3);
    }
    vArr->pArray = ppvVar5;
    vArr->nCap = iVar10;
  }
  ppvVar7 = ppvVar9 + iVar4;
  ppvVar5 = ppvVar8 + iVar1;
  ppvVar6 = vArr->pArray;
  if (0 < iVar1 && 0 < iVar4) {
    do {
      pvVar2 = *ppvVar9;
      pvVar3 = *ppvVar8;
      iVar4 = *(int *)((long)pvVar3 + 0x24);
      if (*(int *)((long)pvVar2 + 0x24) == iVar4) {
        ppvVar9 = ppvVar9 + 1;
        *ppvVar6 = pvVar2;
        ppvVar8 = ppvVar8 + 1;
      }
      else if (*(int *)((long)pvVar2 + 0x24) < iVar4) {
        ppvVar9 = ppvVar9 + 1;
        *ppvVar6 = pvVar2;
      }
      else {
        ppvVar8 = ppvVar8 + 1;
        *ppvVar6 = pvVar3;
      }
      ppvVar6 = ppvVar6 + 1;
    } while ((ppvVar9 < ppvVar7) && (ppvVar8 < ppvVar5));
  }
  for (; ppvVar9 < ppvVar7; ppvVar9 = ppvVar9 + 1) {
    *ppvVar6 = *ppvVar9;
    ppvVar6 = ppvVar6 + 1;
  }
  for (; ppvVar8 < ppvVar5; ppvVar8 = ppvVar8 + 1) {
    *ppvVar6 = *ppvVar8;
    ppvVar6 = ppvVar6 + 1;
  }
  iVar4 = (int)((ulong)((long)ppvVar6 - (long)vArr->pArray) >> 3);
  vArr->nSize = iVar4;
  if (vArr->nCap < iVar4) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x4e8,"void Aig_NodeUnionLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (iVar4 < vArr1->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x4e9,"void Aig_NodeUnionLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (iVar4 < vArr2->nSize) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x4ea,"void Aig_NodeUnionLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  return;
}

Assistant:

void Aig_NodeUnionLists( Vec_Ptr_t * vArr1, Vec_Ptr_t * vArr2, Vec_Ptr_t * vArr )
{
    Aig_Obj_t ** pBeg  = (Aig_Obj_t **)vArr->pArray;
    Aig_Obj_t ** pBeg1 = (Aig_Obj_t **)vArr1->pArray;
    Aig_Obj_t ** pBeg2 = (Aig_Obj_t **)vArr2->pArray;
    Aig_Obj_t ** pEnd1 = (Aig_Obj_t **)vArr1->pArray + vArr1->nSize;
    Aig_Obj_t ** pEnd2 = (Aig_Obj_t **)vArr2->pArray + vArr2->nSize;
    Vec_PtrGrow( vArr, Vec_PtrSize(vArr1) + Vec_PtrSize(vArr2) );
    pBeg  = (Aig_Obj_t **)vArr->pArray;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( (*pBeg1)->Id == (*pBeg2)->Id )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( (*pBeg1)->Id < (*pBeg2)->Id )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    vArr->nSize = pBeg - (Aig_Obj_t **)vArr->pArray;
    assert( vArr->nSize <= vArr->nCap );
    assert( vArr->nSize >= vArr1->nSize );
    assert( vArr->nSize >= vArr2->nSize );
}